

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManReadExpression(Prs_Man_t *p,int OutItem)

{
  Vec_Int_t *p_00;
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  byte *pbVar8;
  int iVar9;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint extraout_EDX_08;
  ulong uVar10;
  char *pcVar11;
  char cVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int local_34;
  
  p_00 = &p->vTemp;
  (p->vTemp).nSize = 0;
  Vec_IntPush(p_00,0);
  Vec_IntPush(p_00,OutItem);
  pbVar2 = (byte *)p->pLimit;
  pbVar8 = (byte *)p->pCur;
  while (pbVar8 < pbVar2) {
    while( true ) {
      uVar10 = (ulong)*pbVar8;
      if (0x2f < uVar10) goto LAB_003ef5af;
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
    }
    if (uVar10 != 0x2f) {
      if (uVar10 != 0) {
LAB_003ef5af:
        pcVar7 = p->pCur;
        bVar13 = true;
        if (*pcVar7 != '(') goto LAB_003ef666;
        cVar12 = '(';
        pcVar11 = pcVar7;
        goto LAB_003ef5c7;
      }
      break;
    }
    if (pbVar8[1] != 0x2a) {
      if (pbVar8[1] == 0x2f) {
        pbVar8 = pbVar8 + 2;
        p->pCur = (char *)pbVar8;
        if (pbVar8 < pbVar2) {
          while (*pbVar8 != 10) {
            pbVar8 = pbVar8 + 1;
            p->pCur = (char *)pbVar8;
            if (pbVar8 == pbVar2) goto LAB_003ef5af;
          }
          pbVar8 = pbVar8 + 1;
          goto LAB_003ef594;
        }
      }
      goto LAB_003ef5af;
    }
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar2 <= pbVar8) goto LAB_003ef5af;
    while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar2) goto LAB_003ef5af;
    }
    pbVar8 = pbVar8 + 2;
LAB_003ef594:
    p->pCur = (char *)pbVar8;
  }
  goto LAB_003efa96;
  while (cVar12 = *pcVar11, cVar12 != ';') {
LAB_003ef5c7:
    pcVar11 = pcVar11 + 1;
    if (cVar12 == '>') {
      cVar12 = '(';
      pcVar11 = pcVar7;
      goto LAB_003ef5e4;
    }
  }
  bVar13 = true;
  goto LAB_003ef5fa;
LAB_003ef793:
  if (pbVar2 <= pbVar8) goto LAB_003efa96;
  while( true ) {
    uVar10 = (ulong)*pbVar8;
    uVar4 = (uint)*pbVar8;
    if (0x2f < uVar10) goto LAB_003efafa;
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
    pbVar8 = pbVar8 + 1;
    p->pCur = (char *)pbVar8;
  }
  if (uVar10 != 0x2f) {
    if (uVar10 != 0) goto LAB_003efafa;
    goto LAB_003efa96;
  }
  bVar1 = pbVar8[1];
  uVar4 = (uint)bVar1;
  if (bVar1 == 0x2a) {
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar2 <= pbVar8) goto LAB_003efafa;
    while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar2) goto LAB_003efafa;
    }
    pbVar8 = pbVar8 + 2;
  }
  else {
    if (bVar1 != 0x2f) {
LAB_003efafa:
      if (bVar13 == false) {
        Prs_ManUtilSkipUntilWord(p,";");
        p->pCur = p->pCur + -1;
      }
      else if ((*p->pCur != ',') && (*p->pCur != ';')) {
        pcVar7 = "Trailing symbols on this line.";
LAB_003ef8b6:
        Prs_ManErrorSet(p,pcVar7,uVar4);
        return 0;
      }
      Prs_NtkAddBox(p->pNtk,local_34,0,p_00);
      return 1;
    }
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar2 <= pbVar8) goto LAB_003efafa;
    while (*pbVar8 != 10) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar2) goto LAB_003efafa;
    }
    pbVar8 = pbVar8 + 1;
  }
  p->pCur = (char *)pbVar8;
  goto LAB_003ef793;
  while (cVar12 = *pcVar11, cVar12 != ';') {
LAB_003ef5e4:
    pcVar11 = pcVar11 + 1;
    bVar13 = cVar12 != '<';
    if (cVar12 == '<') break;
  }
LAB_003ef5fa:
  bVar14 = true;
  iVar9 = 0;
  cVar12 = '(';
  do {
    if ((bVar14) && (iVar9 = (iVar9 + (uint)(cVar12 == '(')) - (uint)(cVar12 == ')'), iVar9 == 0))
    goto LAB_003ef653;
    bVar15 = cVar12 != '\\';
    bVar3 = cVar12 == ' ';
    if (!bVar15) {
      bVar3 = bVar15;
    }
    if (bVar14) {
      bVar3 = bVar15;
    }
    bVar14 = bVar3;
    cVar12 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
  } while (cVar12 != '\0');
  pcVar7 = (char *)0x0;
LAB_003ef653:
  if (pcVar7 == (char *)0x0) {
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Expecting closing parenthesis 1.",0x21);
      return 0;
    }
  }
  else {
    *pcVar7 = ' ';
    *p->pCur = ' ';
LAB_003ef666:
    pbVar2 = (byte *)p->pLimit;
    pbVar8 = (byte *)p->pCur;
    while (pbVar8 < pbVar2) {
      while( true ) {
        uVar10 = (ulong)*pbVar8;
        if (0x2f < uVar10) goto LAB_003ef746;
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
      }
      if (uVar10 != 0x2f) {
        if (uVar10 != 0) {
LAB_003ef746:
          bVar1 = *p->pCur;
          bVar14 = (byte)(bVar1 - 0x30) < 10;
          cVar12 = bVar14 || bVar1 == 0x7b;
          if (bVar14 || bVar1 == 0x7b) {
            iVar9 = Prs_ManReadSignal(p);
            Vec_IntPush(p_00,0);
            Vec_IntPush(p_00,iVar9);
            local_34 = 8;
            goto LAB_003ef78b;
          }
          local_34 = 0x21;
          if (bVar1 == 0x21) {
LAB_003ef865:
            p->pCur = p->pCur + 1;
            iVar9 = Prs_ManUtilSkipSpaces(p);
            uVar4 = extraout_EDX;
            if (iVar9 == 0) {
              if (*p->pCur == '(') {
                pcVar7 = Prs_ManFindClosingParenthesis(p,cVar12,(char)extraout_EDX);
                if (pcVar7 == (char *)0x0) {
                  pcVar7 = "Expecting closing parenthesis 2.";
                  uVar4 = extraout_EDX_00;
                  goto LAB_003ef8b6;
                }
                *pcVar7 = ' ';
                *p->pCur = ' ';
              }
              iVar9 = Prs_ManUtilSkipSpaces(p);
              uVar4 = extraout_EDX_01;
              if (iVar9 == 0) {
                iVar9 = Prs_ManReadSignal(p);
                if (iVar9 == 0) {
                  pcVar7 = "Cannot read name after a unary operator.";
                  uVar4 = extraout_EDX_05;
                  goto LAB_003ef8b6;
                }
                Vec_IntPush(p_00,0);
                Vec_IntPush(p_00,iVar9);
LAB_003ef78b:
                pbVar2 = (byte *)p->pLimit;
                pbVar8 = (byte *)p->pCur;
                goto LAB_003ef793;
              }
            }
          }
          else {
            if ((((bVar1 - 0x26 < 0x39) &&
                 (cVar12 = -0x7f, (0x100000004000081U >> ((ulong)(bVar1 - 0x26) & 0x3f) & 1) != 0))
                || (bVar1 == 0x7e)) || (bVar1 == 0x7c)) {
              if (bVar1 != 0x21) {
                if (bVar1 < 0x5e) {
                  if (bVar1 == 0x26) {
                    local_34 = 0x1b;
                  }
                  else if (bVar1 == 0x2d) {
                    local_34 = 0x37;
                  }
                  else {
                    if (bVar1 != 0x40) {
LAB_003efa30:
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                                    ,0x398,"int Prs_ManReadExpression(Prs_Man_t *, int)");
                    }
                    local_34 = 0x38;
                  }
                }
                else if (bVar1 == 0x5e) {
                  local_34 = 0x1f;
                }
                else if (bVar1 == 0x7c) {
                  local_34 = 0x1d;
                }
                else {
                  local_34 = 9;
                  if (bVar1 != 0x7e) goto LAB_003efa30;
                }
              }
              goto LAB_003ef865;
            }
            uVar4 = Prs_ManReadSignal(p);
            if (uVar4 == 0) {
              pcVar7 = "Cannot read name after a binary operator.";
              uVar4 = extraout_EDX_02;
              goto LAB_003ef8b6;
            }
            if ((int)uVar4 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x13d,"int Abc_Lit2Var2(int)");
            }
            if (uVar4 >> 2 != p->FuncNameId) {
              Vec_IntPush(p_00,0);
              Vec_IntPush(p_00,uVar4);
              iVar9 = Prs_ManUtilSkipSpaces(p);
              uVar4 = extraout_EDX_06;
              if (iVar9 != 0) goto LAB_003efba7;
              pbVar2 = (byte *)p->pCur;
              bVar1 = *pbVar2;
              if (bVar1 < 0x3f) {
                local_34 = 8;
                if ((bVar1 != 0x2c) && (bVar1 != 0x3b)) goto LAB_003efcb4;
              }
              else {
                if (bVar1 == 0x3f) {
                  p->pCur = (char *)(pbVar2 + 1);
                  iVar9 = Prs_ManReadSignal(p);
                  if (iVar9 == 0) {
                    return 0;
                  }
                  Vec_IntPush(p_00,0);
                  Vec_IntPush(p_00,iVar9);
                  iVar9 = Prs_ManUtilSkipSpaces(p);
                  uVar4 = extraout_EDX_07;
                  if (iVar9 == 0) {
                    if (*p->pCur != ':') {
                      pcVar7 = "MUX lacks the colon symbol (:).";
                      goto LAB_003efbae;
                    }
                    p->pCur = p->pCur + 1;
                    iVar9 = Prs_ManReadSignal(p);
                    if (iVar9 == 0) {
                      return 0;
                    }
                    Vec_IntPush(p_00,0);
                    Vec_IntPush(p_00,iVar9);
                    iVar9 = Prs_ManUtilSkipSpaces(p);
                    uVar4 = extraout_EDX_08;
                    if (iVar9 == 0) {
                      local_34 = 0x12;
                      if ((p->vTemp).nSize != 8) {
                        __assert_fail("Vec_IntSize(&p->vTemp) == 8",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                                      ,0x3e2,"int Prs_ManReadExpression(Prs_Man_t *, int)");
                      }
                      goto LAB_003ef78b;
                    }
                  }
                  goto LAB_003efba7;
                }
                if (bVar1 == 0x5b) {
                  __assert_fail("!Prs_ManIsChar(p, \'[\')",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                                ,0x3cd,"int Prs_ManReadExpression(Prs_Man_t *, int)");
                }
LAB_003efcb4:
                if (bVar1 == 0x3e) {
                  if ((pbVar2[1] == 0x3e) && (pbVar2[2] != 0x3e)) {
                    p->pCur = (char *)(pbVar2 + 2);
                    local_34 = (uint)(bVar13 ^ 1) * 4 + 0x42;
                  }
                  else {
                    if ((pbVar2[1] != 0x3e) || (pbVar2[2] != 0x3e)) goto LAB_003efcef;
                    p->pCur = (char *)(pbVar2 + 3);
                    local_34 = 0x44;
                  }
                }
                else {
LAB_003efcef:
                  if (bVar1 == 0x3c) {
                    if ((pbVar2[1] == 0x3c) && (pbVar2[2] != 0x3c)) {
                      p->pCur = (char *)(pbVar2 + 2);
                      local_34 = (uint)(bVar13 ^ 1) * 4 + 0x41;
                    }
                    else {
                      if ((pbVar2[1] != 0x3c) || (pbVar2[2] != 0x3c)) goto LAB_003efd2a;
                      p->pCur = (char *)(pbVar2 + 3);
                      local_34 = 0x43;
                    }
                  }
                  else {
LAB_003efd2a:
                    if ((bVar1 == 0x26) && (pbVar2[1] != 0x26)) {
                      p->pCur = (char *)(pbVar2 + 1);
                      local_34 = 10;
                    }
                    else if ((bVar1 == 0x7c) && (pbVar2[1] != 0x7c)) {
                      p->pCur = (char *)(pbVar2 + 1);
                      local_34 = 0xc;
                    }
                    else if ((bVar1 == 0x5e) && (pbVar2[1] != 0x5e)) {
                      p->pCur = (char *)(pbVar2 + 1);
                      local_34 = 0xe;
                    }
                    else if ((bVar1 == 0x26) && (pbVar2[1] == 0x26)) {
                      p->pCur = (char *)(pbVar2 + 2);
                      local_34 = 0x22;
                    }
                    else if ((bVar1 == 0x7c) && (pbVar2[1] == 0x7c)) {
                      p->pCur = (char *)(pbVar2 + 2);
                      local_34 = 0x24;
                    }
                    else if (bVar1 == 0x21) {
                      if (pbVar2[1] != 0x3d) goto LAB_003efe71;
                      p->pCur = (char *)(pbVar2 + 2);
                      local_34 = 0x40;
                    }
                    else if ((bVar1 == 0x3d) && (pbVar2[1] == 0x3d)) {
                      p->pCur = (char *)(pbVar2 + 2);
                      local_34 = 0x3f;
                    }
                    else {
LAB_003efe71:
                      if ((bVar1 == 0x3c) && (pbVar2[1] != 0x3d)) {
                        p->pCur = (char *)(pbVar2 + 1);
                        local_34 = 0x3b;
                      }
                      else if ((bVar1 == 0x3e) && (pbVar2[1] != 0x3d)) {
                        p->pCur = (char *)(pbVar2 + 1);
                        local_34 = 0x3e;
                      }
                      else if ((bVar1 == 0x3c) && (pbVar2[1] == 0x3d)) {
                        p->pCur = (char *)(pbVar2 + 2);
                        local_34 = 0x3c;
                      }
                      else if ((bVar1 == 0x3e) && (pbVar2[1] == 0x3d)) {
                        p->pCur = (char *)(pbVar2 + 2);
                        local_34 = 0x3d;
                      }
                      else {
                        uVar4 = bVar1 - 0x25;
                        uVar10 = (ulong)uVar4;
                        if (10 < uVar4) {
switchD_003efee5_caseD_1:
                          pcVar7 = "Unsupported operation.";
LAB_003efbae:
                          Prs_ManErrorSet(p,pcVar7,uVar4);
                          return 0;
                        }
                        uVar4 = (&switchD_003efee5::switchdataD_009b79d4)[uVar10] + 0x9b79d4;
                        switch(uVar10) {
                        case 0:
switchD_003efee5_caseD_0:
                          p->pCur = (char *)(pbVar2 + 1);
                          local_34 = 0x34;
                          break;
                        default:
                          goto switchD_003efee5_caseD_1;
                        case 5:
                          if (pbVar2[1] == 0x2a) {
                            if (bVar1 != 0x25) {
                              if (bVar1 == 0x2a) {
                                if (pbVar2[1] == 0x2a) {
                                  p->pCur = (char *)(pbVar2 + 2);
                                  local_34 = 0x36;
                                  break;
                                }
                              }
                              else if (bVar1 == 0x2f) goto switchD_003efee5_caseD_a;
                              goto switchD_003efee5_caseD_1;
                            }
                            goto switchD_003efee5_caseD_0;
                          }
                          p->pCur = (char *)(pbVar2 + 1);
                          local_34 = 0x31;
                          break;
                        case 6:
                          p->pCur = (char *)(pbVar2 + 1);
                          local_34 = 0x2f;
                          break;
                        case 8:
                          p->pCur = (char *)(pbVar2 + 1);
                          local_34 = 0x30;
                          break;
                        case 10:
switchD_003efee5_caseD_a:
                          p->pCur = (char *)(pbVar2 + 1);
                          local_34 = 0x33;
                        }
                      }
                    }
                  }
                }
                iVar9 = Prs_ManReadSignal(p);
                if (iVar9 == 0) {
                  return 0;
                }
                Vec_IntPush(p_00,0);
                Vec_IntPush(p_00,iVar9);
                if (local_34 == 0x2f) {
                  Vec_IntInsert(p_00,2,0);
                  Vec_IntInsert(p_00,3,0);
                  local_34 = 0x2f;
                }
              }
              goto LAB_003ef78b;
            }
            iVar9 = Prs_ManUtilSkipSpaces(p);
            uVar4 = extraout_EDX_03;
            if ((iVar9 == 0) && (*p->pCur == '(')) {
              p->pCur = p->pCur + 1;
              iVar5 = 1;
              iVar9 = Prs_ManReadSignalList(p,p_00,')',1);
              uVar6 = (p->vTemp).nSize;
              if (p->FuncRangeId != 0) {
                iVar5 = Ptr_NtkRangeSize(p->pNtk,p->FuncRangeId);
              }
              p->FuncNameId = 0;
              p->FuncRangeId = 0;
              if (iVar9 == 0) {
                return 0;
              }
              iVar9 = 0x2d;
              if ((uVar6 & 0xfffffffe) != 2) {
                uVar6 = (int)uVar6 / 2;
                iVar9 = 0x29;
                if (uVar6 != iVar5 + 1U) {
                  uVar4 = (1 << ((byte)iVar5 & 0x1f)) + 1;
                  iVar9 = 0x28;
                  if (uVar6 != uVar4) {
                    pcVar7 = "Cannot determine word-level operator.";
                    goto LAB_003efbae;
                  }
                }
              }
              p->pCur = p->pCur + 1;
              iVar5 = Prs_ManUtilSkipSpaces(p);
              uVar4 = extraout_EDX_04;
              if (iVar5 == 0) {
                Vec_IntInsert(p_00,0,0);
                Vec_IntInsert(p_00,1,OutItem);
                Prs_NtkAddBox(p->pNtk,iVar9,0,p_00);
                return 1;
              }
LAB_003efba7:
              pcVar7 = "Error number 24.";
              goto LAB_003efbae;
            }
          }
          pcVar7 = "Error number 24.";
          goto LAB_003ef8b6;
        }
        break;
      }
      if (pbVar8[1] != 0x2a) {
        if (pbVar8[1] == 0x2f) {
          pbVar8 = pbVar8 + 2;
          p->pCur = (char *)pbVar8;
          if (pbVar8 < pbVar2) {
            while (*pbVar8 != 10) {
              pbVar8 = pbVar8 + 1;
              p->pCur = (char *)pbVar8;
              if (pbVar8 == pbVar2) goto LAB_003ef746;
            }
            pbVar8 = pbVar8 + 1;
            goto LAB_003ef702;
          }
        }
        goto LAB_003ef746;
      }
      pbVar8 = pbVar8 + 2;
      p->pCur = (char *)pbVar8;
      if (pbVar2 <= pbVar8) goto LAB_003ef746;
      while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
        if (pbVar8 == pbVar2) goto LAB_003ef746;
      }
      pbVar8 = pbVar8 + 2;
LAB_003ef702:
      p->pCur = (char *)pbVar8;
    }
LAB_003efa96:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Error number 24.",0x11);
        return 0;
      }
    }
  }
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
}

Assistant:

static inline int Prs_ManReadExpression( Prs_Man_t * p, int OutItem )
{
    char * pClose;
    int Item, Type = CBA_OBJ_NONE;
    int fRotating = 0;

    // write output name
    Vec_IntClear( &p->vTemp );
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, OutItem );
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    if ( Prs_ManIsChar(p, '(') )
    {
        // THIS IS A HACK TO DETECT rotating shifters:  try to find both << and >> on the same line
        if ( Prs_ManUtilDetectTwo(p, '>', '>') && Prs_ManUtilDetectTwo(p, '<', '<') )
            fRotating = 1;
        pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
        if ( pClose == NULL )
            return Prs_ManErrorSet(p, "Expecting closing parenthesis 1.", 0); 
        *p->pCur = *pClose = ' ';
    }
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    // read constant or concatenation
    if ( Prs_ManIsDigit(p) || Prs_ManIsChar(p, '{') )
    {
        Item = Prs_ManReadSignal( p );
        // write constant
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        Type = CBA_BOX_BUF;
    }
    else if ( Prs_ManIsChar(p, '!') || Prs_ManIsChar(p, '~') || Prs_ManIsChar(p, '@') ||
              Prs_ManIsChar(p, '&') || Prs_ManIsChar(p, '|') || Prs_ManIsChar(p, '^') || Prs_ManIsChar(p, '-') )
    {
        if ( Prs_ManIsChar(p, '!') )
            Type = CBA_BOX_LNOT;
        else if ( Prs_ManIsChar(p, '~') )
            Type = CBA_BOX_INV;
        else if ( Prs_ManIsChar(p, '@') )
            Type = CBA_BOX_SQRT;
        else if ( Prs_ManIsChar(p, '&') )
            Type = CBA_BOX_RAND;
        else if ( Prs_ManIsChar(p, '|') )
            Type = CBA_BOX_ROR;
        else if ( Prs_ManIsChar(p, '^') )
            Type = CBA_BOX_RXOR;
        else if ( Prs_ManIsChar(p, '-') )
            Type = CBA_BOX_MIN;
        else assert( 0 );
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // skip parentheses
        if ( Prs_ManIsChar(p, '(') )
        {
            pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
            if ( pClose == NULL )
                return Prs_ManErrorSet(p, "Expecting closing parenthesis 2.", 0); 
            *p->pCur = *pClose = ' ';
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a unary operator.", 0);
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
    }
    else
    {
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a binary operator.", 0);
        // check if this is a recent function
        if ( Abc_Lit2Var2(Item) == p->FuncNameId )
        {
            int Status, nInputs, RangeSize;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, '(') )       return Prs_ManErrorSet(p, "Error number 24.", 0);
            p->pCur++;
            Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
            nInputs = Vec_IntSize(&p->vTemp)/2;
            RangeSize = p->FuncRangeId ? Ptr_NtkRangeSize(p->pNtk, p->FuncRangeId) : 1;
            p->FuncNameId = p->FuncRangeId = 0;
            if ( Status == 0 )                  return 0;
            if ( nInputs == 1 )
                Type = CBA_BOX_DEC;
            else if ( nInputs == RangeSize + 1 )
                Type = CBA_BOX_SEL;
            else if ( nInputs == (1 << RangeSize) + 1 )
                Type = CBA_BOX_NMUX;
            else                                return Prs_ManErrorSet(p, "Cannot determine word-level operator.", 0);
            p->pCur++;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            // save word-level operator
            Vec_IntInsert( &p->vTemp, 0, 0 );
            Vec_IntInsert( &p->vTemp, 1, OutItem );
            Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
            return 1;
        }
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        assert( !Prs_ManIsChar(p, '[') );

        // get the next symbol
        if ( Prs_ManIsChar(p, ',') || Prs_ManIsChar(p, ';') )
            Type = CBA_BOX_BUF;
        else if ( Prs_ManIsChar(p, '?') )
        {
            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, ':') )       return Prs_ManErrorSet(p, "MUX lacks the colon symbol (:).", 0);

            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            assert( Vec_IntSize(&p->vTemp) == 8 );
            //ABC_SWAP( int, Vec_IntArray(&p->vTemp)[3], Vec_IntArray(&p->vTemp)[5] );
            Type = CBA_BOX_MUX;
        }
        else 
        {
                 if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] != '>' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTR : CBA_BOX_SHIR;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] == '>' )  p->pCur += 3, Type = CBA_BOX_SHIRA;      
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] != '<' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTL : CBA_BOX_SHIL;
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] == '<' )  p->pCur += 3, Type = CBA_BOX_SHILA;      
            else if ( p->pCur[0] == '&' && p->pCur[1] != '&'                      )  p->pCur += 1, Type = CBA_BOX_AND;       
            else if ( p->pCur[0] == '|' && p->pCur[1] != '|'                      )  p->pCur += 1, Type = CBA_BOX_OR;        
            else if ( p->pCur[0] == '^' && p->pCur[1] != '^'                      )  p->pCur += 1, Type = CBA_BOX_XOR;       
            else if ( p->pCur[0] == '&' && p->pCur[1] == '&'                      )  p->pCur += 2, Type = CBA_BOX_LAND;     
            else if ( p->pCur[0] == '|' && p->pCur[1] == '|'                      )  p->pCur += 2, Type = CBA_BOX_LOR;      
            else if ( p->pCur[0] == '=' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_EQU;      
            else if ( p->pCur[0] == '!' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_NEQU;      
            else if ( p->pCur[0] == '<' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_LTHAN;     
            else if ( p->pCur[0] == '>' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_MTHAN;     
            else if ( p->pCur[0] == '<' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_LETHAN;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_METHAN;  
            else if ( p->pCur[0] == '+'                                           )  p->pCur += 1, Type = CBA_BOX_ADD;       
            else if ( p->pCur[0] == '-'                                           )  p->pCur += 1, Type = CBA_BOX_SUB;       
            else if ( p->pCur[0] == '*' && p->pCur[1] != '*'                      )  p->pCur += 1, Type = CBA_BOX_MUL;     
            else if ( p->pCur[0] == '/'                                           )  p->pCur += 1, Type = CBA_BOX_DIV;        
            else if ( p->pCur[0] == '%'                                           )  p->pCur += 1, Type = CBA_BOX_MOD;   
            else if ( p->pCur[0] == '*' && p->pCur[1] == '*'                      )  p->pCur += 2, Type = CBA_BOX_POW;
            else return Prs_ManErrorSet(p, "Unsupported operation.", 0);

            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            // for adder insert carry-in
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 2, 0 );
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 3, 0 );
        }
    }
    if ( Prs_ManUtilSkipSpaces(p) )                              return Prs_ManErrorSet(p, "Error number 24.", 0);
    // make sure there is nothing left there
    if ( fRotating )
    {
        Prs_ManUtilSkipUntilWord(p, ";");
        p->pCur--;
    }
    else if ( !Prs_ManIsChar(p, ',') && !Prs_ManIsChar(p, ';') ) return Prs_ManErrorSet(p, "Trailing symbols on this line.", 0);
    // save binary operator
    Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
    return 1;
}